

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

Entry * kj::_::
        CopyConstructArray_<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,_kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry_*,_true,_false>
        ::apply(Entry *pos,Entry *start,Entry *end)

{
  if (start != end) {
    do {
      (pos->key).content.ptr = (start->key).content.ptr;
      (pos->key).content.size_ = (start->key).content.size_;
      (pos->value).disposer = (start->value).disposer;
      (start->key).content.ptr = (char *)0x0;
      (start->key).content.size_ = 0;
      Maybe<kj::Promise<void>_>::Maybe
                ((Maybe<kj::Promise<void>_> *)&(pos->value).ptr,
                 (Maybe<kj::Promise<void>_> *)&(start->value).ptr);
      pos[1].key.content.size_ = start[1].key.content.size_;
      pos[1].value.disposer = start[1].value.disposer;
      start[1].value.disposer = (Disposer *)0x0;
      pos = (Entry *)&pos[1].value.ptr;
      start = (Entry *)&start[1].value.ptr;
    } while (start != end);
  }
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }